

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTabs.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckTabs(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  size_t pos;
  bool bVar2;
  bool bVar3;
  sregex_iterator currentTabIterator;
  sregex_iterator end;
  sregex lineWithTabRegex;
  Error error;
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  intrusive_ptr<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::xpressive::detail::tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_0L>
  local_70;
  value_type local_68;
  
  this->m_TestsDone[10] = true;
  std::__cxx11::string::_M_replace
            ((ulong)(this->m_TestsDescription + 10),0,
             (char *)this->m_TestsDescription[10]._M_string_length,0x178948);
  boost::xpressive::
  basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::compile((basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_70,"^[^\\r\\n]*?(\\t)[^\\r\\n]*$",ECMAScript);
  begin._M_current = (this->m_Buffer)._M_dataplus._M_p;
  boost::xpressive::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::regex_iterator(&local_80,begin,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(begin._M_current + (this->m_Buffer)._M_string_length),
                   (basic_regex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_70,format_default);
  local_78.px = (regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0;
  bVar2 = true;
  paVar1 = &local_68.description.field_2;
  do {
    bVar3 = local_78.px ==
            (regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0;
    if (local_80.impl_.px ==
        (regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
LAB_0015491b:
      if (bVar3 != false) {
        boost::
        intrusive_ptr<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~intrusive_ptr(&local_78);
        boost::
        intrusive_ptr<boost::xpressive::detail::regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~intrusive_ptr(&local_80.impl_);
        if (local_70.child0.impl_.px !=
            (intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )0x0) {
          boost::xpressive::detail::
          enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::release((enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_70.child0.impl_.px);
        }
        return bVar2;
      }
    }
    else if (local_78.px !=
             (regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0) {
      bVar3 = boost::xpressive::detail::
              regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::equal_to((regex_iterator_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_80.impl_.px,local_78.px);
      goto LAB_0015491b;
    }
    local_68.description._M_string_length = 0;
    local_68.description.field_2._M_local_buf[0] = '\0';
    local_68.description._M_dataplus._M_p = (pointer)paVar1;
    pos = boost::xpressive::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)local_80.impl_.px + 0x10),1);
    local_68.line = GetLineNumber(this,pos,false);
    local_68.number = 10;
    local_68.line2 = local_68.line;
    std::__cxx11::string::_M_replace
              ((ulong)&local_68.description,0,(char *)local_68.description._M_string_length,0x178982
              );
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.description._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.description._M_dataplus._M_p);
    }
    boost::xpressive::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::fork_(&local_80);
    bVar2 = false;
    boost::xpressive::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::next_(&local_80);
  } while( true );
}

Assistant:

bool Parser::CheckTabs()
{
  m_TestsDone[TABS] = true;
  m_TestsDescription[TABS] = "The file should not have any tabs";

  bool hasError = false;

  sregex lineWithTabRegex = sregex::compile(R"(^[^\r\n]*?(\t)[^\r\n]*$)");
  sregex_iterator currentTabIterator(m_Buffer.begin(), m_Buffer.end(), lineWithTabRegex);
  sregex_iterator end;

  for (; currentTabIterator != end; ++currentTabIterator)
    {
    Error error;
    smatch const &currentMatch = *currentTabIterator;
    error.line   = this->GetLineNumber(currentMatch.position(1), false); 
    error.line2  = error.line;
    error.number = TABS;
    error.description = "Tabs identified";
    m_ErrorList.push_back(error);    
    hasError = true;
    }

  return !hasError;
}